

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple_management.hpp
# Opt level: O2

void burst::management::manage<DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_111()::aligned_by_4>
               (operation_t todo,void *source,void *destination)

{
  uint __line;
  
  switch(todo) {
  case copy:
  case move:
    *(undefined4 *)destination = *source;
    break;
  case destroy:
    if (source != (void *)0x0) {
      __line = 0x56;
LAB_00190885:
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,__line,
                    "void burst::management::manage(operation_t, const void *, void *) [T = aligned_by_4]"
                   );
    }
    break;
  case size:
    if (source != (void *)0x0) {
      __line = 0x5c;
      goto LAB_00190885;
    }
    *(undefined8 *)destination = 4;
    break;
  case type:
    if (source != (void *)0x0) {
      __line = 0x62;
      goto LAB_00190885;
    }
    *(pointer_____offset_0x10___ **)destination =
         &DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_111()::aligned_by_4::typeinfo;
  }
  return;
}

Assistant:

void manage (operation_t todo, const void * source, void * destination)
        {
            switch (todo)
            {
                case operation_t::copy:
                {
                    copy<T>(source, destination);
                    break;
                }
                case operation_t::move:
                {
                    move<T>(const_cast<void *>(source), destination);
                    break;
                }
                case operation_t::destroy:
                {
                    assert(source == nullptr);
                    destroy<T>(destination);
                    break;
                }
                case operation_t::size:
                {
                    assert(source == nullptr);
                    *static_cast<std::size_t *>(destination) = sizeof(T);
                    break;
                }
                case operation_t::type:
                {
                    assert(source == nullptr);
                    *static_cast<const std::type_info **>(destination) = std::addressof(typeid(T));
                    break;
                }
            }
        }